

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O2

void __thiscall MyGame::Example::AnyUnion::AnyUnion(AnyUnion *this,AnyUnion *u)

{
  Any AVar1;
  MonsterT *this_00;
  
  AVar1 = u->type;
  this->value = (void *)0x0;
  this->type = AVar1;
  if (AVar1 == Any_MAX) {
    this_00 = (MonsterT *)operator_new(1);
  }
  else if (AVar1 == Any_TestSimpleTableWithEnum) {
    this_00 = (MonsterT *)operator_new(1);
    *(undefined1 *)
     &(this_00->pos)._M_t.
      super___uniq_ptr_impl<MyGame::Example::Vec3,_std::default_delete<MyGame::Example::Vec3>_>._M_t
      .super__Tuple_impl<0UL,_MyGame::Example::Vec3_*,_std::default_delete<MyGame::Example::Vec3>_>.
      super__Head_base<0UL,_MyGame::Example::Vec3_*,_false>._M_head_impl = *u->value;
  }
  else {
    if (AVar1 != Any_Monster) {
      return;
    }
    this_00 = (MonsterT *)operator_new(800);
    MonsterT::MonsterT(this_00,(MonsterT *)u->value);
  }
  this->value = this_00;
  return;
}

Assistant:

inline AnyUnion::AnyUnion(const AnyUnion &u) : type(u.type), value(nullptr) {
  switch (type) {
    case Any_Monster: {
      value = new MyGame::Example::MonsterT(*reinterpret_cast<MyGame::Example::MonsterT *>(u.value));
      break;
    }
    case Any_TestSimpleTableWithEnum: {
      value = new MyGame::Example::TestSimpleTableWithEnumT(*reinterpret_cast<MyGame::Example::TestSimpleTableWithEnumT *>(u.value));
      break;
    }
    case Any_MyGame_Example2_Monster: {
      value = new MyGame::Example2::MonsterT(*reinterpret_cast<MyGame::Example2::MonsterT *>(u.value));
      break;
    }
    default:
      break;
  }
}